

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O0

void __thiscall inja::Renderer::throw_renderer_error(Renderer *this,string *message,AstNode *node)

{
  string_view content;
  RenderError *this_00;
  SourceLocation location;
  SourceLocation loc;
  AstNode *node_local;
  string *message_local;
  Renderer *this_local;
  
  content = (string_view)
            ::std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&this->current_template->content);
  location = get_source_location(content,node->pos);
  this_00 = (RenderError *)__cxa_allocate_exception(0x60);
  RenderError::RenderError(this_00,message,location);
  __cxa_throw(this_00,&RenderError::typeinfo,RenderError::~RenderError);
}

Assistant:

void throw_renderer_error(const std::string& message, const AstNode& node) {
    const SourceLocation loc = get_source_location(current_template->content, node.pos);
    INJA_THROW(RenderError(message, loc));
  }